

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmPMove<(moira::Instr)184,(moira::Mode)8,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  Syntax SVar9;
  int iVar10;
  char *pcVar11;
  long lVar12;
  char cVar13;
  Int i;
  Int i_00;
  Moira *this_00;
  uint uVar14;
  byte bVar15;
  ushort uVar16;
  char *pcVar17;
  char *pcVar18;
  Ea<(moira::Mode)8,_2> result;
  u32 local_4c;
  ushort local_48;
  uint local_44;
  u32 *local_38;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  this_00 = this;
  uVar8 = (*this->_vptr_Moira[6])();
  uVar14 = uVar8 & 0xffff;
  SVar9 = str->style->syntax;
  if ((SVar9 & ~MOIRA_MIT) == GNU) {
    bVar7 = isValidExtMMU(this_00,PMOVE,AL,op,uVar14);
    if (!bVar7) {
      *addr = uVar1;
      dasmIllegal<(moira::Instr)184,(moira::Mode)8,0>(this,str,addr,op);
      return;
    }
    SVar9 = str->style->syntax;
  }
  uVar16 = op & 7;
  uVar3 = uVar14 >> 0xd;
  uVar4 = uVar14 >> 10;
  pcVar18 = "%";
  pcVar17 = "";
  if ((SVar9 & ~GNU) != MOIRA_MIT) {
    pcVar18 = "";
  }
  pcVar11 = "fd";
  if ((uVar14 >> 8 & 1) == 0) {
    pcVar11 = "";
  }
  if (uVar3 != 3) {
    if (uVar3 == 2) {
      switch(uVar4 & 7) {
      case 0:
        pcVar17 = "tc";
        break;
      case 1:
        pcVar17 = "drp";
        break;
      case 2:
        pcVar17 = "srp";
        break;
      case 3:
        pcVar17 = "crp";
        break;
      case 4:
        pcVar17 = "cal";
        break;
      case 5:
        pcVar17 = "val";
        break;
      case 6:
        pcVar17 = "scc";
        break;
      case 7:
        pcVar17 = "ac";
      }
    }
    else {
      if (uVar3 != 0) {
LAB_003ebdd2:
        bVar7 = false;
        goto switchD_003ebe16_default;
      }
      if ((uVar4 & 7) == 3) {
        pcVar17 = "tt1";
      }
      else {
        if ((uVar4 & 7) != 2) goto LAB_003ebdd2;
        pcVar17 = "tt0";
      }
    }
    bVar6 = true;
    bVar5 = false;
    goto switchD_003ebe16_caseD_2;
  }
  bVar5 = false;
  bVar6 = false;
  bVar7 = false;
  switch(uVar4 & 7) {
  case 0:
    pcVar17 = "psr";
    break;
  case 1:
    pcVar17 = "pcsr";
    break;
  case 2:
  case 3:
    goto switchD_003ebe16_caseD_2;
  case 4:
    pcVar17 = "bad";
    break;
  case 5:
    pcVar17 = "bac";
    break;
  default:
    goto switchD_003ebe16_default;
  }
  bVar7 = true;
switchD_003ebe16_default:
  bVar5 = bVar7;
  bVar6 = false;
switchD_003ebe16_caseD_2:
  bVar15 = (byte)(uVar14 >> 2) & 7;
  cVar13 = 'p';
  lVar12 = 1;
  if ((uVar14 >> 9 & 1) == 0) {
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar13;
      cVar13 = "pmove"[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 6);
    cVar13 = *pcVar11;
    while (cVar13 != '\0') {
      pcVar11 = pcVar11 + 1;
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar13;
      cVar13 = *pcVar11;
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar11 = str->ptr;
      str->ptr = pcVar11 + 1;
      *pcVar11 = ' ';
    }
    else {
      iVar10 = (str->tab).raw;
      pcVar11 = str->ptr;
      do {
        str->ptr = pcVar11 + 1;
        *pcVar11 = ' ';
        pcVar11 = str->ptr;
      } while (pcVar11 < str->base + iVar10);
    }
    if (bVar5) {
      local_4c = *addr;
      *addr = local_4c + 2;
      local_48 = uVar16;
      iVar10 = (*this->_vptr_Moira[6])(this);
      *addr = *addr + 2;
      local_38 = addr;
      uVar14 = (*this->_vptr_Moira[6])(this);
      local_44 = uVar14 & 0xffff | iVar10 << 0x10;
      StrWriter::operator<<(str,(Ea<(moira::Mode)8,_2> *)&local_4c);
      pcVar11 = str->ptr;
      str->ptr = pcVar11 + 1;
      *pcVar11 = ',';
      SVar9 = str->style->syntax;
      addr = local_38;
      if ((SVar9 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar9 & 0x1f) & 1) != 0)) {
        pcVar11 = str->ptr;
        str->ptr = pcVar11 + 1;
        *pcVar11 = ' ';
      }
    }
    if (bVar6) {
      local_4c = *addr;
      *addr = local_4c + 2;
      local_48 = uVar16;
      iVar10 = (*this->_vptr_Moira[6])(this);
      *addr = *addr + 2;
      uVar14 = (*this->_vptr_Moira[6])(this);
      local_44 = uVar14 & 0xffff | iVar10 << 0x10;
      StrWriter::operator<<(str,(Ea<(moira::Mode)8,_4> *)&local_4c);
      pcVar11 = str->ptr;
      str->ptr = pcVar11 + 1;
      *pcVar11 = ',';
      SVar9 = str->style->syntax;
      if ((SVar9 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar9 & 0x1f) & 1) != 0)) {
        pcVar11 = str->ptr;
        str->ptr = pcVar11 + 1;
        *pcVar11 = ' ';
      }
    }
    cVar13 = *pcVar18;
    while (cVar13 != '\0') {
      pcVar18 = pcVar18 + 1;
      pcVar11 = str->ptr;
      str->ptr = pcVar11 + 1;
      *pcVar11 = cVar13;
      cVar13 = *pcVar18;
    }
    cVar13 = *pcVar17;
    while (cVar13 != '\0') {
      pcVar17 = pcVar17 + 1;
      pcVar18 = str->ptr;
      str->ptr = pcVar18 + 1;
      *pcVar18 = cVar13;
      cVar13 = *pcVar17;
    }
    if ((uVar8 & 0x1800) != 0 && uVar3 == 3) {
      i.raw._1_3_ = 0;
      i.raw._0_1_ = bVar15;
      StrWriter::operator<<(str,i);
    }
  }
  else {
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar13;
      cVar13 = "pmove"[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 6);
    cVar13 = *pcVar11;
    while (cVar13 != '\0') {
      pcVar11 = pcVar11 + 1;
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar13;
      cVar13 = *pcVar11;
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar11 = str->ptr;
      str->ptr = pcVar11 + 1;
      *pcVar11 = ' ';
    }
    else {
      iVar10 = (str->tab).raw;
      pcVar11 = str->ptr;
      do {
        str->ptr = pcVar11 + 1;
        *pcVar11 = ' ';
        pcVar11 = str->ptr;
      } while (pcVar11 < str->base + iVar10);
    }
    if ((uVar8 & 0x1800) != 0 && uVar3 == 3) {
      i_00.raw._1_3_ = 0;
      i_00.raw._0_1_ = bVar15;
      StrWriter::operator<<(str,i_00);
    }
    cVar13 = *pcVar18;
    while (cVar13 != '\0') {
      pcVar18 = pcVar18 + 1;
      pcVar11 = str->ptr;
      str->ptr = pcVar11 + 1;
      *pcVar11 = cVar13;
      cVar13 = *pcVar18;
    }
    cVar13 = *pcVar17;
    while (cVar13 != '\0') {
      pcVar17 = pcVar17 + 1;
      pcVar18 = str->ptr;
      str->ptr = pcVar18 + 1;
      *pcVar18 = cVar13;
      cVar13 = *pcVar17;
    }
    if (bVar5) {
      pcVar18 = str->ptr;
      str->ptr = pcVar18 + 1;
      *pcVar18 = ',';
      SVar9 = str->style->syntax;
      if ((SVar9 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar9 & 0x1f) & 1) != 0)) {
        pcVar18 = str->ptr;
        str->ptr = pcVar18 + 1;
        *pcVar18 = ' ';
      }
      local_4c = *addr;
      *addr = local_4c + 2;
      local_48 = uVar16;
      iVar10 = (*this->_vptr_Moira[6])(this);
      *addr = *addr + 2;
      uVar8 = (*this->_vptr_Moira[6])(this);
      local_44 = uVar8 & 0xffff | iVar10 << 0x10;
      StrWriter::operator<<(str,(Ea<(moira::Mode)8,_2> *)&local_4c);
    }
    if (bVar6) {
      pcVar18 = str->ptr;
      str->ptr = pcVar18 + 1;
      *pcVar18 = ',';
      SVar9 = str->style->syntax;
      if ((SVar9 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar9 & 0x1f) & 1) != 0)) {
        pcVar18 = str->ptr;
        str->ptr = pcVar18 + 1;
        *pcVar18 = ' ';
      }
      local_4c = *addr;
      *addr = local_4c + 2;
      local_48 = uVar16;
      iVar10 = (*this->_vptr_Moira[6])(this);
      *addr = *addr + 2;
      uVar8 = (*this->_vptr_Moira[6])(this);
      local_44 = uVar8 & 0xffff | iVar10 << 0x10;
      StrWriter::operator<<(str,(Ea<(moira::Mode)8,_4> *)&local_4c);
    }
  }
  return;
}

Assistant:

void
Moira::dasmPMove(StrWriter &str, u32 &addr, u16 op) const
{
    auto old  = addr;
    auto ext  = dasmIncRead<Word>(addr);
    auto reg  = _____________xxx (op);
    auto fmt  = xxx_____________ (ext);
    auto preg = ___xxx__________ (ext);
    auto nr   = ___________xxx__ (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    const char *prefix = str.style.syntax == Syntax::GNU_MIT || str.style.syntax == Syntax::MOIRA_MIT ? "%" : "";
    const char *suffix = (ext & 0x100) ? "fd" : "";
    const char *r = "";
    Size s = Size(Unsized);

    switch (fmt) {

        case 0:

            switch (preg) {

                case 0b010: r = "tt0";  s = Long; break;
                case 0b011: r = "tt1";  s = Long; break;
            }
            break;

        case 2:

            switch (preg) {

                case 0b000: r = "tc";   s = Long; break;
                case 0b001: r = "drp";  s = Long; break;
                case 0b010: r = "srp";  s = Long; break;
                case 0b011: r = "crp";  s = Long; break;
                case 0b100: r = "cal";  s = Long; break;
                case 0b101: r = "val";  s = Long; break;
                case 0b110: r = "scc";  s = Long; break;
                case 0b111: r = "ac";   s = Long; break;
            }
            break;

        case 3:

            switch (preg) {

                case 0b000: r = "psr";  s = Word; break;
                case 0b001: r = "pcsr"; s = Word; break;
                case 0b100: r = "bad";  s = Word; break;
                case 0b101: r = "bac";  s = Word; break;
            }
            break;
    }

    if (!(ext & 0x200)) {

        str << Ins<I>{} << suffix << str.tab;
        if (s == Word) str << Op<M, Word>(reg, addr) << Sep{};
        if (s == Long) str << Op<M, Long>(reg, addr) << Sep{};
        str << prefix << r;
        if (fmt == 3 && preg > 1) str << Int(nr);

    } else {

        str << Ins<I>{} << suffix << str.tab;
        if (fmt == 3 && preg > 1) str << Int(nr);
        str << prefix << r;
        if (s == Word) str << Sep{} << Op<M, Word>(reg, addr);
        if (s == Long) str << Sep{} << Op<M, Long>(reg, addr);
    }
}